

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ProjectionLight::Phi(ProjectionLight *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  WrapMode2D wrapMode;
  array<float,_4> aVar3;
  Float *pFVar4;
  Point2i PVar5;
  RGBColorSpace *in_RDI;
  Float FVar6;
  ulong uVar15;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar22 [60];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  Point3<float> PVar24;
  Vector3<float> VVar25;
  SampledSpectrum SVar26;
  SampledSpectrum L;
  int c;
  RGB rgb;
  Float dwdA;
  Vector3f w;
  Point2f ps;
  int u;
  int v;
  SampledSpectrum sum;
  SampledSpectrum *in_stack_fffffffffffffe38;
  Image *pIVar27;
  undefined4 in_stack_fffffffffffffe40;
  Float in_stack_fffffffffffffe44;
  Float FVar28;
  Bounds2<float> *in_stack_fffffffffffffe48;
  RGBColorSpace *in_stack_fffffffffffffe50;
  float fVar29;
  undefined4 uVar30;
  SampledWavelengths *lambda_00;
  RGBSpectrum *this_00;
  int iVar31;
  RGBSpectrum *in_stack_fffffffffffffeb0;
  Image *in_stack_fffffffffffffeb8;
  WrapMode in_stack_fffffffffffffec4;
  WrapMode in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  Bounds2<float> local_120 [2];
  undefined8 local_f4;
  undefined8 local_ec;
  int local_d4;
  RGB local_d0;
  float local_c4;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_ac;
  float local_a4;
  undefined8 local_a0;
  float local_98;
  undefined8 local_80;
  float local_78;
  undefined8 local_74;
  float local_6c;
  Tuple2<pbrt::Point2,_int> local_68;
  Tuple2<pbrt::Point2,_int> local_60;
  undefined1 local_58 [24];
  Float local_40;
  Tuple2<pbrt::Point2,_int> local_3c;
  int local_34;
  RGBColorSpace *p;
  Transform *in_stack_fffffffffffffff0;
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [56];
  undefined1 auVar23 [56];
  
  p = in_RDI;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (Float)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  local_34 = 0;
  while( true ) {
    iVar31 = local_34;
    local_3c = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 1));
    if (local_3c.y <= iVar31) break;
    local_40 = 0.0;
    while( true ) {
      FVar28 = local_40;
      local_58._16_8_ = Image::Resolution((Image *)(in_RDI + 1));
      if ((int)local_58._16_4_ <= (int)FVar28) break;
      lambda_00 = (SampledWavelengths *)(in_RDI[2].RGBFromXYZ.m[2] + 2);
      uVar30 = 0x3f000000;
      fVar29 = (float)(int)local_40 + 0.5;
      pIVar27 = (Image *)(in_RDI + 1);
      local_60 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(pIVar27);
      local_68 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(pIVar27);
      this_00 = (RGBSpectrum *)local_58;
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (float)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 SUB84(in_stack_fffffffffffffe38,0));
      auVar7._0_8_ = Bounds2<float>::Lerp
                               (in_stack_fffffffffffffe48,
                                (Point2f *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      auVar7._8_56_ = extraout_var_00;
      local_58._8_8_ = vmovlpd_avx(auVar7._0_16_);
      auVar16 = (undefined1  [56])0x0;
      auVar22 = (undefined1  [60])0x0;
      Point3<float>::Point3
                ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (float)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 SUB84(in_stack_fffffffffffffe38,0),0.0);
      PVar24 = Transform::operator()(in_stack_fffffffffffffff0,(Point3<float> *)p);
      local_98 = PVar24.super_Tuple3<pbrt::Point3,_float>.z;
      auVar8._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar8._8_56_ = auVar16;
      local_a0 = vmovlpd_avx(auVar8._0_16_);
      local_80 = local_a0;
      local_78 = local_98;
      Vector3<float>::Vector3<float>
                ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (Point3<float> *)in_stack_fffffffffffffe38);
      VVar25 = Normalize<float>((Vector3<float> *)CONCAT44(uVar30,fVar29));
      auVar17._0_4_ = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._4_60_ = auVar22;
      auVar9._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar16;
      local_c0 = vmovlpd_avx(auVar9._0_16_);
      local_b8 = auVar17._0_4_;
      local_ac = local_c0;
      local_a4 = auVar17._0_4_;
      local_74 = local_c0;
      local_6c = auVar17._0_4_;
      auVar10._0_4_ = Pow<3>(in_stack_fffffffffffffe44);
      auVar10._4_60_ = extraout_var;
      local_c4 = auVar10._0_4_;
      RGB::RGB(&local_d0);
      local_d4 = 0;
      while( true ) {
        auVar23 = auVar17._8_56_;
        auVar16 = auVar10._8_56_;
        if (2 < local_d4) break;
        in_stack_fffffffffffffe50 = in_RDI + 1;
        Point2<int>::Point2((Point2<int> *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                            (int)in_stack_fffffffffffffe38);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)in_stack_fffffffffffffe50,
                   (WrapMode)((ulong)in_stack_fffffffffffffe48 >> 0x20));
        PVar5.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffed0;
        PVar5.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffecc;
        wrapMode.wrap.values[1] = in_stack_fffffffffffffec8;
        wrapMode.wrap.values[0] = in_stack_fffffffffffffec4;
        FVar6 = Image::GetChannel(in_stack_fffffffffffffeb8,PVar5,
                                  (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),wrapMode);
        pFVar4 = RGB::operator[](&local_d0,local_d4);
        auVar10 = ZEXT464((uint)FVar6);
        *pFVar4 = FVar6;
        local_d4 = local_d4 + 1;
      }
      in_stack_fffffffffffffe48 = local_120;
      RGBSpectrum::RGBSpectrum(in_stack_fffffffffffffeb0,in_RDI,(RGB *)CONCAT44(iVar31,FVar28));
      SVar26 = RGBSpectrum::Sample(this_00,lambda_00);
      auVar18._0_8_ = SVar26.values.values._8_8_;
      auVar18._8_56_ = auVar23;
      auVar11._0_8_ = SVar26.values.values._0_8_;
      auVar11._8_56_ = auVar16;
      local_f4 = vmovlpd_avx(auVar11._0_16_);
      local_ec = vmovlpd_avx(auVar18._0_16_);
      auVar16 = (undefined1  [56])0x0;
      SVar26 = SampledSpectrum::operator*
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (Float)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      auVar19._0_8_ = SVar26.values.values._8_8_;
      auVar19._8_56_ = auVar23;
      auVar12._0_8_ = SVar26.values.values._0_8_;
      auVar12._8_56_ = auVar16;
      uVar1 = vmovlpd_avx(auVar12._0_16_);
      in_stack_fffffffffffffed0 = (int)uVar1;
      vmovlpd_avx(auVar19._0_16_);
      SampledSpectrum::operator+=
                ((SampledSpectrum *)in_stack_fffffffffffffe50,
                 (SampledSpectrum *)in_stack_fffffffffffffe48);
      local_40 = (Float)((int)local_40 + 1);
    }
    local_34 = local_34 + 1;
  }
  auVar23 = (undefined1  [56])0x0;
  auVar16 = (undefined1  [56])0x0;
  SVar26 = pbrt::operator*(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38);
  auVar20._0_8_ = SVar26.values.values._8_8_;
  auVar20._8_56_ = auVar23;
  auVar13._0_8_ = SVar26.values.values._0_8_;
  auVar13._8_56_ = auVar16;
  uVar15 = auVar16._0_8_;
  vmovlpd_avx(auVar13._0_16_);
  vmovlpd_avx(auVar20._0_16_);
  pIVar27 = (Image *)(in_RDI + 1);
  PVar5 = Image::Resolution(pIVar27);
  FVar28 = (Float)PVar5.super_Tuple2<pbrt::Point2,_int>.x;
  Image::Resolution(pIVar27);
  auVar16 = ZEXT856(uVar15);
  SVar26 = SampledSpectrum::operator/((SampledSpectrum *)in_stack_fffffffffffffe48,FVar28);
  auVar21._0_8_ = SVar26.values.values._8_8_;
  auVar21._8_56_ = auVar23;
  auVar14._0_8_ = SVar26.values.values._0_8_;
  auVar14._8_56_ = auVar16;
  uVar1 = vmovlpd_avx(auVar14._0_16_);
  uVar2 = vmovlpd_avx(auVar21._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum ProjectionLight::Phi(const SampledWavelengths &lambda) const {
    SampledSpectrum sum(0.f);
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp(
                {(u + .5f) / image.Resolution().x, (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);

            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c);

            SampledSpectrum L = RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

            sum += L * dwdA;
        }

    return scale * A * sum / (image.Resolution().x * image.Resolution().y);
}